

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_repeat_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::
simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<false>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (simple_repeat_matcher<boost::xpressive::detail::matcher_wrapper<boost::xpressive::detail::any_matcher>,mpl_::bool_<false>>
           *this,long *state,long *next)

{
  long lVar1;
  char cVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  
  lVar1 = *state;
  uVar5 = *(uint *)(this + 4);
  lVar4 = lVar1;
  uVar3 = uVar5;
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    if (lVar4 == state[4]) goto LAB_0012874b;
    lVar4 = lVar4 + 1;
    *state = lVar4;
  }
  while( true ) {
    cVar2 = (**(code **)(*next + 0x10))(next,state);
    if (cVar2 != '\0') {
      return true;
    }
    if (*(uint *)(this + 8) <= uVar5) break;
    if (*state == state[4]) goto LAB_0012874b;
    uVar5 = uVar5 + 1;
    *state = *state + 1;
  }
LAB_0012874f:
  *state = lVar1;
  return false;
LAB_0012874b:
  *(undefined1 *)((long)state + 0x31) = 1;
  goto LAB_0012874f;
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, non_greedy_tag) const
        {
            BOOST_ASSERT(!this->leading_);
            BidiIter const tmp = state.cur_;
            unsigned int matches = 0;

            for(; matches < this->min_; ++matches)
            {
                if(!this->xpr_.match(state))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            do
            {
                if(next.match(state))
                {
                    return true;
                }
            }
            while(matches++ < this->max_ && this->xpr_.match(state));

            state.cur_ = tmp;
            return false;
        }